

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O2

btScalar FindMaxSeparation(int *edgeIndex,btBox2dShape *poly1,btTransform *xf1,btBox2dShape *poly2,
                          btTransform *xf2)

{
  bool bVar1;
  long lVar2;
  int edge1;
  int edge1_00;
  int edge1_01;
  btScalar bVar3;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  btVector3 bVar7;
  btVector3 bVar8;
  float local_a8;
  float fStack_a4;
  float local_98;
  btVector3 dLocal1;
  btVector3 d;
  btScalar maxDot;
  
  bVar7 = btTransform::operator()(xf2,&poly2->m_centroid);
  bVar8 = btTransform::operator()(xf1,&poly1->m_centroid);
  local_a8 = bVar7.m_floats[0];
  fStack_a4 = bVar7.m_floats[1];
  local_98 = bVar7.m_floats[2];
  d.m_floats[1] = fStack_a4 - bVar8.m_floats[1];
  d.m_floats[0] = local_a8 - bVar8.m_floats[0];
  d.m_floats[2] = local_98 - bVar8.m_floats[2];
  d.m_floats[3] = 0.0;
  btMatrix3x3::transpose((btMatrix3x3 *)&maxDot,&xf1->m_basis);
  dLocal1 = operator*((btMatrix3x3 *)&maxDot,&d);
  lVar2 = btVector3::maxDot(&dLocal1,poly1->m_normals,4,&maxDot);
  edge1_00 = (int)lVar2;
  bVar3 = EdgeSeparation(poly1,xf1,edge1_00,poly2,xf2);
  bVar5 = bVar3;
  if (bVar3 <= 0.0) {
    edge1_01 = edge1_00 + -1;
    if (edge1_00 < 1) {
      edge1_01 = 3;
    }
    bVar4 = EdgeSeparation(poly1,xf1,edge1_01,poly2,xf2);
    bVar5 = bVar4;
    if (bVar4 <= 0.0) {
      edge1 = 0;
      if (edge1_00 < 3) {
        edge1 = edge1_00 + 1;
      }
      bVar5 = EdgeSeparation(poly1,xf1,edge1,poly2,xf2);
      if (bVar5 <= 0.0) {
        bVar1 = bVar3 < bVar4;
        bVar6 = bVar4;
        if ((bVar1 && bVar5 < bVar4) || (bVar6 = bVar5, edge1_01 = edge1, bVar3 < bVar5)) {
          do {
            edge1_00 = edge1_01;
            bVar3 = bVar6;
            if (bVar1 && bVar5 < bVar4) {
              edge1_01 = edge1_00 + -1;
              if (edge1_00 < 1) {
                edge1_01 = 3;
              }
            }
            else {
              edge1_01 = edge1_00 + 1;
              if (2 < edge1_00) {
                edge1_01 = 0;
              }
            }
            bVar6 = EdgeSeparation(poly1,xf1,edge1_01,poly2,xf2);
            if (0.0 < bVar6) {
              return bVar6;
            }
          } while (bVar3 < bVar6);
        }
        *edgeIndex = edge1_00;
        bVar5 = bVar3;
      }
    }
  }
  return bVar5;
}

Assistant:

static btScalar FindMaxSeparation(int* edgeIndex,
								 const btBox2dShape* poly1, const btTransform& xf1,
								 const btBox2dShape* poly2, const btTransform& xf2)
{
	int count1 = poly1->getVertexCount();
	const btVector3* normals1 = poly1->getNormals();

	// Vector pointing from the centroid of poly1 to the centroid of poly2.
	btVector3 d = b2Mul(xf2, poly2->getCentroid()) - b2Mul(xf1, poly1->getCentroid());
	btVector3 dLocal1 = b2MulT(xf1.getBasis(), d);

	// Find edge normal on poly1 that has the largest projection onto d.
	int edge = 0;
    btScalar maxDot;
    if( count1 > 0 )
        edge = (int) dLocal1.maxDot( normals1, count1, maxDot);

	// Get the separation for the edge normal.
	btScalar s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
	if (s > 0.0f)
	{
		return s;
	}

	// Check the separation for the previous edge normal.
	int prevEdge = edge - 1 >= 0 ? edge - 1 : count1 - 1;
	btScalar sPrev = EdgeSeparation(poly1, xf1, prevEdge, poly2, xf2);
	if (sPrev > 0.0f)
	{
		return sPrev;
	}

	// Check the separation for the next edge normal.
	int nextEdge = edge + 1 < count1 ? edge + 1 : 0;
	btScalar sNext = EdgeSeparation(poly1, xf1, nextEdge, poly2, xf2);
	if (sNext > 0.0f)
	{
		return sNext;
	}

	// Find the best edge and the search direction.
	int bestEdge;
	btScalar bestSeparation;
	int increment;
	if (sPrev > s && sPrev > sNext)
	{
		increment = -1;
		bestEdge = prevEdge;
		bestSeparation = sPrev;
	}
	else if (sNext > s)
	{
		increment = 1;
		bestEdge = nextEdge;
		bestSeparation = sNext;
	}
	else
	{
		*edgeIndex = edge;
		return s;
	}

	// Perform a local search for the best edge normal.
	for ( ; ; )
	{
		if (increment == -1)
			edge = bestEdge - 1 >= 0 ? bestEdge - 1 : count1 - 1;
		else
			edge = bestEdge + 1 < count1 ? bestEdge + 1 : 0;

		s = EdgeSeparation(poly1, xf1, edge, poly2, xf2);
		if (s > 0.0f)
		{
			return s;
		}

		if (s > bestSeparation)
		{
			bestEdge = edge;
			bestSeparation = s;
		}
		else
		{
			break;
		}
	}

	*edgeIndex = bestEdge;
	return bestSeparation;
}